

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::pban_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  uint uVar2;
  int cn_00;
  clientinfo *pcVar3;
  char *pcVar4;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (cn < 0x3e9) {
      pcVar3 = QServ::getClient(&qs,cn);
      if (pcVar3 != (clientinfo *)0x0) {
        if (pcVar3->connected == true) {
          uVar2 = QServ::getSender(&qs);
          if (((cn != uVar2) && (pcVar3->connected == true)) && (args[1] != (char *)0x0)) {
            uVar2 = QServ::getSender(&qs);
            if (cn != uVar2) {
              pcVar3 = QServ::getClient(&qs,cn);
              pcVar4 = colorname(pcVar3);
              out(3,"\f0%s \f7has been permanently banned.",pcVar4);
              pcVar4 = colorname(pcVar3);
              out(4,"%s has been permanently banned.",pcVar4);
              ipban(pcVar3->ip);
              disconnect_client(cn,5);
              return;
            }
          }
        }
        return;
      }
      cn_00 = QServ::getSender(&qs);
      pcVar4 = "\f3Error: Player not connected";
      goto LAB_00151428;
    }
  }
  else {
    QServ::getSender(&qs);
  }
  cn_00 = QServ::getSender(&qs);
  pcVar4 = QServ::getCommandDesc(&qs,cid);
LAB_00151428:
  sendf(cn_00,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK pban_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                clientinfo *ci = qs.getClient(cn);
                if(ci != NULL) {
                    if(ci->connected) {
                        if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL && cn!=CMD_SENDER) {
                            //ipban doesn't get listed on listbans
                            clientinfo *ci = qs.getClient(cn);
                            out(ECHO_SERV, "\f0%s \f7has been permanently banned.", colorname(ci));
                            out(ECHO_NOCOLOR, "%s has been permanently banned.", colorname(ci));
                            server::ipban(ci->ip);
                            disconnect_client(cn, DISC_IPBAN);
                        }
                    }
                } else {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                }
                
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            usage = true;
        }
        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }